

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_AddCommonExprs_Test::TestBody(ProblemTest_AddCommonExprs_Test *this)

{
  char *pcVar1;
  AssertHelper local_380;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  AssertionResult gtest_ar;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars(&p,1,CONTINUOUS);
  local_378.ptr_._0_4_ = 0;
  local_380.data_._0_4_ =
       (undefined4)
       (((long)p.linear_exprs_.super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)p.linear_exprs_.super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x78);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","p.num_common_exprs()",(int *)&local_378,(int *)&local_380);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x212,pcVar1);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs(&p,2);
  local_378.ptr_._0_4_ = 2;
  local_380.data_._0_4_ =
       (undefined4)
       (((long)p.linear_exprs_.super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)p.linear_exprs_.super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x78);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","p.num_common_exprs()",(int *)&local_378,(int *)&local_380);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x214,pcVar1);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, AddCommonExprs) {
  Problem p;
  p.AddVars(1, mp::var::CONTINUOUS);
  EXPECT_EQ(0, p.num_common_exprs());
  p.AddCommonExprs(2);
  EXPECT_EQ(2, p.num_common_exprs());
}